

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_MemCmpEQ_Test::Body(iu_AssertionTest_x_iutest_x_MemCmpEQ_Test *this)

{
  AssertionResult iutest_ar;
  TestObjectX y;
  TestObjectX x;
  allocator<char> local_209;
  AssertionResult local_208;
  AssertionHelper local_1e0;
  TestObjectX local_1b0;
  TestObjectX local_1a0;
  undefined1 local_190 [392];
  
  local_1a0.c = 2;
  local_1a0.a = 0;
  local_1a0.b = 1;
  local_1b0.c = 2;
  local_1b0.a = 0;
  local_1b0.b = 1;
  iutest::internal::CmpHelperMemCmpEQ<TestObjectX>(&local_208,"x","y",&local_1a0,&local_1b0);
  if (local_208.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,local_208.m_message._M_dataplus._M_p,&local_209);
    local_1e0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
    ;
    local_1e0.m_part_result.super_iuCodeMessage.m_line = 0x73;
    local_1e0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1e0,(Fixed *)local_190,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.m_message._M_dataplus._M_p != &local_208.m_message.field_2) {
    operator_delete(local_208.m_message._M_dataplus._M_p,
                    local_208.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, MemCmpEQ)
{
    TestObjectX x={0, 1, 2};
    TestObjectX y={0, 1, 2};
    IUTEST_ASSERT_EQ(x, y);
}